

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfChromaticitiesAttribute.cpp
# Opt level: O0

void __thiscall
Imf_3_4::TypedAttribute<Imf_3_4::Chromaticities>::writeValueTo
          (TypedAttribute<Imf_3_4::Chromaticities> *this,OStream *os,int version)

{
  OStream *in_RDI;
  float in_stack_ffffffffffffffdc;
  
  Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>(in_RDI,in_stack_ffffffffffffffdc);
  Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>(in_RDI,in_stack_ffffffffffffffdc);
  Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>(in_RDI,in_stack_ffffffffffffffdc);
  Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>(in_RDI,in_stack_ffffffffffffffdc);
  Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>(in_RDI,in_stack_ffffffffffffffdc);
  Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>(in_RDI,in_stack_ffffffffffffffdc);
  Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>(in_RDI,in_stack_ffffffffffffffdc);
  Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>(in_RDI,in_stack_ffffffffffffffdc);
  return;
}

Assistant:

IMF_EXPORT void
ChromaticitiesAttribute::writeValueTo (
    OPENEXR_IMF_INTERNAL_NAMESPACE::OStream& os, int version) const
{
    Xdr::write<StreamIO> (os, _value.red.x);
    Xdr::write<StreamIO> (os, _value.red.y);
    Xdr::write<StreamIO> (os, _value.green.x);
    Xdr::write<StreamIO> (os, _value.green.y);
    Xdr::write<StreamIO> (os, _value.blue.x);
    Xdr::write<StreamIO> (os, _value.blue.y);
    Xdr::write<StreamIO> (os, _value.white.x);
    Xdr::write<StreamIO> (os, _value.white.y);
}